

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.hxx
# Opt level: O3

void __thiscall Time::~Time(Time *this)

{
  ~Time(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

virtual ~Time(){}